

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.cpp
# Opt level: O0

void __thiscall
sjtu::UserManager::add_order(UserManager *this,OrderManager *order_manager,orderType *order)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  long lVar1;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  pair<long,_bool> pVar2;
  userType *cur;
  pair<long,_bool> tmp;
  pair<std::pair<sjtu::orderType,_long>_*,_long> ret;
  allocator *str;
  StringHasher *in_stack_ffffffffffffff70;
  allocator local_61;
  string local_60 [24];
  unsigned_long_long *in_stack_ffffffffffffffb8;
  long local_38;
  undefined1 local_30;
  undefined1 local_28 [16];
  char *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = (**(code **)(**(long **)(in_RSI + 0x10) + 8))();
  memcpy(local_28._0_8_,local_18,0xb8);
  *(undefined8 *)(local_18 + 0xb0) = local_28._8_8_;
  *(undefined8 *)(local_28._0_8_ + 0xb0) = local_28._8_8_;
  str = &local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,local_18,str);
  this_00 = (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)
            StringHasher::operator()(in_stack_ffffffffffffff70,(string *)str);
  pVar2 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (this_00,in_stack_ffffffffffffffb8);
  local_38 = pVar2.first;
  local_30 = pVar2.second;
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  lVar1 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))(*(long **)(in_RDI + 0x10),&local_38);
  *(undefined8 *)(local_28._0_8_ + 0xb8) = *(undefined8 *)(lVar1 + 0x70);
  *(undefined8 *)(lVar1 + 0x70) = local_28._8_8_;
  *(int *)(lVar1 + 0x80) = *(int *)(lVar1 + 0x80) + 1;
  (**(code **)(**(long **)(local_10 + 0x10) + 0x18))
            (*(long **)(local_10 + 0x10),local_28._0_8_ + 0xb0);
  (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))(*(long **)(in_RDI + 0x10),lVar1 + 0x78);
  return;
}

Assistant:

void UserManager::add_order(OrderManager *order_manager, orderType *order) {
            auto ret = order_manager->OrderFile->newspace();          //std::pair<std::pair<orderType , locType>* , locType>
            ret.first -> first = *order;
            ret.first->first.offset = order -> offset = ret.second;
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(order->username));
            userType *cur = UserFile->read(tmp.first);
            ret.first -> second = cur->head;
            cur->head = ret.second;
            ++cur->order_count;
            order_manager->OrderFile->save(ret.first->first.offset);
            UserFile->save(cur->offset);
        }